

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O3

_Bool borg_recharging(void)

{
  _Bool _Var1;
  char *pcVar2;
  borg_item_conflict *pbVar3;
  short sVar4;
  bool bVar5;
  ulong uVar6;
  borg_item_conflict *pbVar7;
  angband_constants *paVar8;
  long lVar9;
  
  if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (z_info->pack_size != 0)) {
    lVar9 = 0;
    uVar6 = 0;
    pbVar7 = borg_items;
    paVar8 = z_info;
    do {
      pbVar3 = pbVar7;
      if (((pbVar7->curses[lVar9 + -0x26] != false) && (pbVar7->curses[lVar9 + -0x2e] == true)) &&
         ((pbVar7->curses[lVar9 + -0x2c] == true &&
          ((*(char **)(pbVar7->curses + lVar9 + -0x3a) == (char *)0x0 ||
           (pcVar2 = strstr(*(char **)(pbVar7->curses + lVar9 + -0x3a),"empty"),
           pcVar2 == (char *)0x0)))))) {
        if (pbVar7->curses[lVar9 + -0x2a] == true) {
          paVar8 = z_info;
          if (*(short *)(pbVar7->curses + lVar9 + -0x28) < 2) {
LAB_0022c319:
            _Var1 = borg_read_scroll(sv_scroll_recharging);
            if ((!_Var1) &&
               ((_Var1 = borg_spell_fail(RECHARGING,L'`'), !_Var1 &&
                (_Var1 = borg_activate_item(act_recharge), !_Var1)))) {
              return false;
            }
            pcVar2 = format("Recharging %s with current charge of %d",pbVar7->desc + lVar9,
                            (ulong)(uint)(int)*(short *)(pbVar7->curses + lVar9 + -0x28));
            borg_note(pcVar2);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar6]);
            if (*(char **)(pbVar7->curses + lVar9 + -0x3a) == (char *)0x0) {
              return true;
            }
            pcVar2 = strstr(*(char **)(pbVar7->curses + lVar9 + -0x3a),"empty");
            if (pcVar2 != (char *)0x0) {
              borg_deinscribe((int)uVar6);
              return true;
            }
            return true;
          }
        }
        else if (pbVar7->curses[lVar9 + -0x2a] == true) {
          sVar4 = *(short *)(pbVar7->curses + lVar9 + -0x28);
          if (sVar4 < 2) {
            _Var1 = borg_spell_okay_fail(RECHARGING,L'`');
            if (_Var1) {
              bVar5 = (int)(uint)pbVar7->curses[lVar9 + -0x29] < sv_staff_power;
            }
            else {
              bVar5 = false;
            }
            sVar4 = *(short *)(pbVar7->curses + lVar9 + -0x28);
            pbVar3 = borg_items;
          }
          else {
            bVar5 = false;
          }
          bVar5 = (bool)(sVar4 < 2 | bVar5);
          if ((sv_staff_teleportation == (uint)pbVar7->curses[lVar9 + -0x29]) && (sVar4 < 3)) {
            bVar5 = (bool)(bVar5 | borg.trait[0x69] == 0);
          }
          paVar8 = z_info;
          if ((sVar4 < 1 || (int)((int)sVar4 + (uint)pbVar7->curses[lVar9 + -0x26]) < 4) && (bVar5))
          goto LAB_0022c319;
        }
      }
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 0x388;
      pbVar7 = pbVar3;
    } while (uVar6 < paVar8->pack_size);
  }
  return false;
}

Assistant:

bool borg_recharging(void)
{
    int  i      = -1;
    bool charge = false;

    /* Forbid blind/confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* XXX XXX XXX Dark */

    /* Look for an item to recharge */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident || !item->aware)
            continue;

        if (item->note && strstr(item->note, "empty"))
            continue;

        /* assume we can't charge it. */
        charge = false;

        /* Wands with no charges can be charged */
        if ((item->tval == TV_WAND) && (item->pval <= 1))
            charge = true;

        /* recharge staves sometimes */
        if (item->tval == TV_STAFF) {
            /* Allow staves to be recharged at 2 charges if
             * the borg has the big recharge spell. And its not a *Dest*
             */
            if ((item->pval < 2) && (borg_spell_okay_fail(RECHARGING, 96))
                && item->sval < sv_staff_power)
                charge = true;

            /* recharge any staff at 0 charges */
            if (item->pval <= 1)
                charge = true;

            /* Staves of teleport get recharged at 2 charges in town */
            if ((item->sval == sv_staff_teleportation) && (item->pval < 3)
                && !borg.trait[BI_CDEPTH])
                charge = true;

            /* They stack.  If quantity is 4 and pval is 1, then there are 4
             * charges. */
            if ((item->iqty + item->pval >= 4) && item->pval >= 1)
                charge = false;
        }

        /* get the next item if we are not to charge this one */
        if (!charge)
            continue;

        /* Attempt to recharge */
        if (borg_read_scroll(sv_scroll_recharging)
            || borg_spell_fail(RECHARGING, 96)
            || borg_activate_item(act_recharge)) {
            /* Message */
            borg_note(format("Recharging %s with current charge of %d",
                item->desc, item->pval));

            /* Recharge the item */
            borg_keypress(all_letters_nohjkl[i]);

            /* Remove the {empty} if present */
            if (item->note && strstr(item->note, "empty"))
                borg_deinscribe(i);

            /* Success */
            return true;
        } else
            /* if we fail once, no need to try again. */
            break;
    }

    /* Nope */
    return false;
}